

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

void __thiscall
duckdb::AsOfLocalState::AsOfLocalState
          (AsOfLocalState *this,ClientContext *context,PhysicalAsOfJoin *op)

{
  pointer pJVar1;
  bool enabled_p;
  Allocator *pAVar2;
  type expr;
  const_reference pvVar3;
  AsOfGlobalSinkState *this_00;
  PartitionLocalSinkState *pPVar4;
  JoinCondition *cond;
  pointer this_01;
  
  (this->super_CachingOperatorState).cached_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_CachingOperatorState).initialized = false;
  (this->super_CachingOperatorState).can_cache_chunk = false;
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__AsOfLocalState_01994650;
  this->context = context;
  pAVar2 = Allocator::Get(context);
  this->allocator = pAVar2;
  this->op = op;
  ExpressionExecutor::ExpressionExecutor(&this->lhs_executor,context);
  DataChunk::DataChunk(&this->lhs_keys);
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->lhs_sel).sel_vector = (sel_t *)0x0;
  (this->lhs_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->lhs_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DataChunk::DataChunk(&this->lhs_payload);
  enabled_p = IsLeftOuterJoin((op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->left_outer,enabled_p);
  this->fetch_next_left = true;
  (this->lhs_partition_sink).ptr = (PartitionLocalSinkState *)0x0;
  DataChunk::Initialize(&this->lhs_keys,this->allocator,&op->join_key_types,0x800);
  pJVar1 = (op->super_PhysicalComparisonJoin).conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_01 = (op->super_PhysicalComparisonJoin).conditions.
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != pJVar1; this_01 = this_01 + 1)
  {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&this_01->left);
    ExpressionExecutor::AddExpression(&this->lhs_executor,expr);
  }
  pAVar2 = this->allocator;
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
  DataChunk::Initialize(&this->lhs_payload,pAVar2,&pvVar3->_M_data->types,0x800);
  SelectionVector::Initialize(&this->lhs_sel,0x800);
  OuterJoinMarker::Initialize(&this->left_outer,0x800);
  this_00 = (AsOfGlobalSinkState *)
            unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator->(&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                          super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  pPVar4 = AsOfGlobalSinkState::RegisterBuffer(this_00,context);
  (this->lhs_partition_sink).ptr = pPVar4;
  return;
}

Assistant:

AsOfLocalState(ClientContext &context, const PhysicalAsOfJoin &op)
	    : context(context), allocator(Allocator::Get(context)), op(op), lhs_executor(context),
	      left_outer(IsLeftOuterJoin(op.join_type)), fetch_next_left(true) {
		lhs_keys.Initialize(allocator, op.join_key_types);
		for (const auto &cond : op.conditions) {
			lhs_executor.AddExpression(*cond.left);
		}

		lhs_payload.Initialize(allocator, op.children[0].get().GetTypes());
		lhs_sel.Initialize();
		left_outer.Initialize(STANDARD_VECTOR_SIZE);

		auto &gsink = op.sink_state->Cast<AsOfGlobalSinkState>();
		lhs_partition_sink = gsink.RegisterBuffer(context);
	}